

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

ai_real Assimp::PLYImporter::NormalizeColorValue(ValueUnion val,EDataType eType)

{
  ai_real aVar1;
  float fVar2;
  
  aVar1 = (ai_real)val.iInt;
  switch(eType) {
  case EDT_Char:
    fVar2 = (float)((int)aVar1 + 0x7f);
    break;
  case EDT_UChar:
    fVar2 = (float)((ulong)val & 0xffffffff);
    break;
  case EDT_Short:
    fVar2 = (float)((int)aVar1 + 0x7fff);
    goto LAB_00454c6c;
  case EDT_UShort:
  case EDT_UInt:
    fVar2 = (float)((ulong)val & 0xffffffff);
LAB_00454c6c:
    return fVar2 / 65535.0;
  case EDT_Int:
    return (float)(int)aVar1 / 255.0 + 0.5;
  case EDT_Float:
    return aVar1;
  case EDT_Double:
    return (float)val.fDouble;
  default:
    return 0.0;
  }
  return fVar2 / 255.0;
}

Assistant:

ai_real PLYImporter::NormalizeColorValue(PLY::PropertyInstance::ValueUnion val, PLY::EDataType eType) {
    switch (eType) {
        case EDT_Float:
            return val.fFloat;
        case EDT_Double:
            return (ai_real)val.fDouble;
        case EDT_UChar:
            return (ai_real)val.iUInt / (ai_real)0xFF;
        case EDT_Char:
            return (ai_real)(val.iInt + (0xFF / 2)) / (ai_real)0xFF;
        case EDT_UShort:
            return (ai_real)val.iUInt / (ai_real)0xFFFF;
        case EDT_Short:
            return (ai_real)(val.iInt + (0xFFFF / 2)) / (ai_real)0xFFFF;
        case EDT_UInt:
            return (ai_real)val.iUInt / (ai_real)0xFFFF;
        case EDT_Int:
            return ((ai_real)val.iInt / (ai_real)0xFF) + 0.5f;
        default:
            break;
    }

    return 0.0f;
}